

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

Slice __thiscall leveldb::anon_unknown_3::DBIter::key(DBIter *this)

{
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  Slice SVar2;
  Slice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->valid_ == false) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0x41,"virtual Slice leveldb::(anonymous namespace)::DBIter::key() const");
  }
  if (this->direction_ == kForward) {
    iVar1 = (*this->iter_->_vptr_Iterator[8])();
    local_18.data_ = (char *)CONCAT44(extraout_var,iVar1);
    SVar2 = ExtractUserKey(&local_18);
  }
  else {
    SVar2.data_ = (this->saved_key_)._M_dataplus._M_p;
    SVar2.size_ = (this->saved_key_)._M_string_length;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Slice key() const override {
    assert(valid_);
    return (direction_ == kForward) ? ExtractUserKey(iter_->key()) : saved_key_;
  }